

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O3

bool __thiscall Clasp::Asp::Preprocessor::preprocessEq(Preprocessor *this,uint32 maxIters)

{
  undefined1 *puVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  size_type sVar4;
  pointer ppPVar5;
  SharedContext *this_00;
  bool bVar6;
  ValueRep VVar7;
  pointer ppPVar8;
  pointer ppPVar9;
  VarVec *supported;
  uint32 uVar10;
  LogicProgram *pLVar11;
  ulong uVar12;
  HeadRange atoms;
  BodyExtra local_44;
  HeadRange local_40;
  
  pLVar11 = this->prg_;
  sVar4 = (((pLVar11->super_ProgramBuilder).ctx_)->varInfo_).ebo_.size;
  this->pass_ = 0;
  this->maxPass_ = maxIters;
  ppPVar5 = (pLVar11->atoms_).ebo_.buf;
  ppPVar2 = ppPVar5 + (pLVar11->input_).lo;
  ppPVar5 = ppPVar5 + (pLVar11->atoms_).ebo_.size;
  local_44 = (BodyExtra)0x0;
  local_40.first = (PrgHead **)ppPVar2;
  local_40.second = (PrgHead **)ppPVar5;
  bk_lib::
  pod_vector<Clasp::Asp::Preprocessor::BodyExtra,_std::allocator<Clasp::Asp::Preprocessor::BodyExtra>_>
  ::resize(&this->bodyInfo_,(pLVar11->bodies_).ebo_.size + 1,&local_44);
  uVar10 = this->pass_;
  while( true ) {
    this->pass_ = uVar10 + 1;
    if (1 < uVar10 + 1) {
      pLVar11 = this->prg_;
      ppPVar8 = (pLVar11->atoms_).ebo_.buf;
      if (ppPVar8 != ppPVar5) {
        do {
          for (; ppPVar8 != ppPVar2; ppPVar8 = ppPVar8 + 1) {
            puVar1 = &((*ppPVar8)->super_PrgHead).field_0x18;
            *(uint *)puVar1 = *(uint *)puVar1 & 0xf7ffffff;
          }
          for (; ppPVar8 != ppPVar5; ppPVar8 = ppPVar8 + 1) {
            ((*ppPVar8)->super_PrgHead).super_PrgNode =
                 (PrgNode)(((ulong)((*ppPVar8)->super_PrgHead).super_PrgNode & 0xffffffff80000000) +
                          1);
            puVar1 = &((*ppPVar8)->super_PrgHead).field_0x18;
            *(uint *)puVar1 = *(uint *)puVar1 & 0xf7ffffff;
          }
        } while (ppPVar8 != ppPVar5);
        pLVar11 = this->prg_;
      }
      uVar12 = (ulong)(pLVar11->disjunctions_).ebo_.size;
      ppPVar9 = (pLVar11->disjunctions_).ebo_.buf;
      if (uVar12 != 0) {
        ppPVar3 = ppPVar9 + uVar12;
        do {
          ((*ppPVar9)->super_PrgHead).super_PrgNode =
               (PrgNode)(((ulong)((*ppPVar9)->super_PrgHead).super_PrgNode & 0xffffffff80000000) + 1
                        );
          puVar1 = &((*ppPVar9)->super_PrgHead).field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xf7ffffff;
          ppPVar9 = ppPVar9 + 1;
        } while (ppPVar9 != ppPVar3);
        pLVar11 = this->prg_;
      }
      this_00 = (pLVar11->super_ProgramBuilder).ctx_;
      SharedContext::popVars(this_00,(this_00->varInfo_).ebo_.size - sVar4);
      (this->litToNode_).ebo_.size = 0;
    }
    supported = LogicProgram::getSupportedBodies(this->prg_,true);
    bVar6 = classifyProgram(this,supported);
    if (!bVar6) break;
    VVar7 = simplifyClassifiedProgram(this,&local_40,this->pass_ != this->maxPass_,supported);
    if ((VVar7 != '\0') || (uVar10 = this->pass_, uVar10 == this->maxPass_)) {
      return VVar7 != '\x02';
    }
  }
  return false;
}

Assistant:

bool Preprocessor::preprocessEq(uint32 maxIters) {
	uint32 startVar = prg_->ctx()->numVars();
	ValueRep res    = value_true;
	pass_           = 0;
	maxPass_        = maxIters;
	HeadRange atoms = HeadRange(prg_->atom_begin() + prg_->startAtom(), prg_->atom_end());
	bodyInfo_.resize( prg_->numBodies() + 1 );
	do {
		if (++pass_ > 1) {
			for (HeadIter it = prg_->atom_begin(), end = atoms.second; it != end; ) {
				while (it != atoms.first){ (*it)->setInUpper(false); ++it; }
				while (it != end)        { (*it)->clearLiteral(false); (*it)->setInUpper(false); ++it; }
			}
			for (HeadIter it = prg_->disj_begin(), end = prg_->disj_end(); it != end; ++it) {
				(*it)->clearLiteral(false);
				(*it)->setInUpper(false);
			}
			prg_->ctx()->popVars(prg_->ctx()->numVars() - startVar);
			litToNode_.clear();
		}
		VarVec& supported = prg_->getSupportedBodies(true);
		if (!classifyProgram(supported)) { return false; }
		res = simplifyClassifiedProgram(atoms, pass_ != maxPass_, supported);
	} while (res == value_free && pass_ != maxPass_);
	return res != value_false;
}